

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setGeometry(QWidget *this,QRect *r)

{
  int y;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  QWExtra *pQVar3;
  QSize QVar4;
  Representation RVar5;
  Representation RVar6;
  bool bVar7;
  QTLWExtra *pQVar8;
  QSize QVar9;
  undefined8 uVar10;
  Representation RVar11;
  QSize QVar12;
  int iVar13;
  long in_FS_OFFSET;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  setAttribute(this,WA_Resized,true);
  setAttribute(this,WA_Moved,true);
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    pQVar8 = QWidgetPrivate::topData(this_00);
    pQVar8->field_0xe1 = pQVar8->field_0xe1 & 0xfe;
  }
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) == 0) {
    pQVar1 = this->data;
    local_48.x1.m_i = (pQVar1->crect).x1.m_i;
    local_48.y1.m_i = (pQVar1->crect).y1.m_i;
    local_48.x2.m_i = (pQVar1->crect).x2.m_i;
    local_48.y2.m_i = (pQVar1->crect).y2.m_i;
    RVar6.m_i = (r->y1).m_i;
    (pQVar1->crect).x1 = (Representation)(r->x1).m_i;
    (pQVar1->crect).y1 = (Representation)RVar6.m_i;
    QVar9 = QRect::size(r);
    lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    if (lVar2 == 0) {
      QVar12.wd.m_i = 0xffffff;
      QVar12.ht.m_i = 0xffffff;
    }
    else {
      QVar12 = *(QSize *)(lVar2 + 0x68);
    }
    QVar4 = QVar12;
    if (QVar9.wd.m_i.m_i < QVar12.wd.m_i.m_i) {
      QVar4 = QVar9;
    }
    RVar5.m_i = QVar12.ht.m_i.m_i;
    if (QVar9.ht.m_i.m_i < QVar12.ht.m_i.m_i) {
      RVar5.m_i = QVar9.ht.m_i.m_i;
    }
    if (lVar2 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *(undefined8 *)(lVar2 + 0x60);
    }
    RVar11.m_i = QVar4.wd.m_i.m_i;
    if (QVar4.wd.m_i.m_i <= (int)uVar10) {
      RVar11.m_i = (int)uVar10;
    }
    iVar13 = (int)((ulong)uVar10 >> 0x20);
    if (iVar13 < RVar5.m_i) {
      iVar13 = RVar5.m_i;
    }
    (pQVar1->crect).x2.m_i = (pQVar1->crect).x1.m_i + RVar11.m_i + -1;
    (pQVar1->crect).y2.m_i = iVar13 + (pQVar1->crect).y1.m_i + -1;
    bVar7 = ::operator!=(&local_48,&this->data->crect);
    if (bVar7) {
      setAttribute(this,WA_PendingMoveEvent,true);
      setAttribute(this,WA_PendingResizeEvent,true);
    }
  }
  else {
    iVar13 = (r->x1).m_i;
    y = (r->y1).m_i;
    QWidgetPrivate::setGeometry_sys
              (this_00,iVar13,y,((r->x2).m_i - iVar13) + 1,((r->y2).m_i - y) + 1,true);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar3 != (QWExtra *)0x0) && ((pQVar3->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasMoved(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setGeometry(const QRect &r)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    setAttribute(Qt::WA_Moved);
    if (isWindow())
        d->topData()->posIncludesFrame = 0;
    if (testAttribute(Qt::WA_WState_Created)) {
        d->setGeometry_sys(r.x(), r.y(), r.width(), r.height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setTopLeft(r.topLeft());
        data->crect.setSize(r.size().boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect) {
            setAttribute(Qt::WA_PendingMoveEvent);
            setAttribute(Qt::WA_PendingResizeEvent);
        }
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}